

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O3

void sorter_binary_insertion_sort_start(int64_t *dst,size_t start,size_t size)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  
  if (start < size) {
    uVar3 = start - 2;
    do {
      lVar2 = dst[start];
      if (lVar2 < dst[start - 1]) {
        uVar7 = uVar3;
        if (lVar2 < *dst) {
          uVar5 = 0;
LAB_00103aa3:
          do {
            dst[uVar7 + 2] = dst[uVar7 + 1];
            if (uVar7 == 0xffffffffffffffff) break;
            bVar9 = uVar5 <= uVar7;
            uVar7 = uVar7 - 1;
          } while (bVar9);
        }
        else {
          uVar1 = start - 1;
          uVar5 = uVar1 >> 1;
          uVar8 = 0;
          uVar6 = uVar1;
LAB_00103a64:
          if ((int)lVar2 - (int)dst[uVar5] < 0) {
            uVar4 = uVar5 - uVar8;
            uVar6 = uVar5;
            if (uVar4 < 2) goto LAB_00103a9b;
LAB_00103a8a:
            uVar5 = (uVar4 >> 1) + uVar8;
            goto LAB_00103a64;
          }
          uVar4 = uVar6 - uVar5;
          uVar8 = uVar5;
          if (1 < uVar4) goto LAB_00103a8a;
          uVar5 = uVar5 + 1;
LAB_00103a9b:
          if (uVar5 <= uVar1) goto LAB_00103aa3;
        }
        dst[uVar5] = lVar2;
      }
      start = start + 1;
      uVar3 = uVar3 + 1;
    } while (start != size);
  }
  return;
}

Assistant:

static void BINARY_INSERTION_SORT_START(SORT_TYPE *dst, const size_t start,
                                        const size_t size) {
  size_t i;

  for (i = start; i < size; i++) {
    size_t j;
    SORT_TYPE x;
    size_t location;

    /* If this entry is already correct, just move along */
    if (SORT_CMP(dst[i - 1], dst[i]) <= 0) {
      continue;
    }

    /* Else we need to find the right place, shift everything over, and squeeze
     * in */
    x = dst[i];
    location = BINARY_INSERTION_FIND(dst, x, i);

    for (j = i - 1; j >= location; j--) {
      dst[j + 1] = dst[j];

      if (j == 0) { /* check edge case because j is unsigned */
        break;
      }
    }

    dst[location] = x;
  }
}